

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PSocket.cpp
# Opt level: O0

int __thiscall P2PSocket::connect(P2PSocket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  P2PSocketException *this_00;
  int *piVar2;
  char *__rhs;
  undefined4 in_register_00000034;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uint local_1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_18;
  int port_local;
  string *remotePeerAddress_local;
  P2PSocket *this_local;
  
  pbStack_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_00000034,__fd);
  local_1c = (uint)__addr;
  remotePeerAddress_local = (string *)this;
  uVar1 = Peers::connect(&this->m_peers,__fd,(sockaddr *)(ulong)(local_1c & 0xffff),__len);
  if ((uVar1 & 1) == 0) {
    this_00 = (P2PSocketException *)__cxa_allocate_exception(0x20);
    std::operator+(&local_c0,"Failed to connect to: ",pbStack_18);
    std::operator+(&local_a0,&local_c0," ");
    std::__cxx11::to_string(&local_f0,local_1c);
    std::operator+(&local_80,&local_a0,&local_f0);
    std::operator+(&local_60,&local_80," ");
    piVar2 = __errno_location();
    __rhs = strerror(*piVar2);
    std::operator+(&local_40,&local_60,__rhs);
    P2PSocketException::P2PSocketException(this_00,&local_40);
    __cxa_throw(this_00,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
  }
  return uVar1;
}

Assistant:

void P2PSocket::connect(const std::string &remotePeerAddress, int port)
{
    if (!this->m_peers.connect(remotePeerAddress, port)) {
        throw P2PSocketException(std::string{"Failed to connect to: " + remotePeerAddress + " " +
                                             std::to_string(port) + " "} +
                                 std::strerror(errno));
    }
}